

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameEngine::GameEngine(GameEngine *this)

{
  int32_t iVar1;
  Config *this_00;
  allocator<char> local_31;
  string local_30;
  
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->manager).super___shared_ptr<Manager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->manager).super___shared_ptr<Manager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Cat",&local_31);
  iVar1 = registerPlayer(this,&local_30);
  this->currentPlayer = iVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Bot",&local_31);
  iVar1 = registerPlayer(this,&local_30);
  this->botID = iVar1;
  std::__cxx11::string::~string((string *)&local_30);
  this_00 = Config::getInstance();
  iVar1 = Config::getMaxStepCount(this_00);
  this->maxStep = iVar1;
  this->currentStep = 0;
  nextStep(this);
  return;
}

Assistant:

GameEngine::GameEngine() {
  currentPlayer = registerPlayer(std::string("Cat"));
  botID = registerPlayer();

  maxStep = Config::getInstance().getMaxStepCount();
  currentStep = 0;

  nextStep();
}